

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.hpp
# Opt level: O2

shared_ptr<helics::CoreFactory::CoreBuilder>
helics::CoreFactory::
addCoreType<helics::NetworkCore<helics::udp::UdpComms,(gmlc::networking::InterfaceTypes)1>>
          (string_view coreTypeName,int code)

{
  int in_ECX;
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr<helics::CoreFactory::CoreBuilder,_(__gnu_cxx::_Lock_policy)2> *__r;
  string_view name;
  shared_ptr<helics::CoreFactory::CoreBuilder> sVar1;
  shared_ptr<helics::CoreFactory::CoreTypeBuilder<helics::NetworkCore<helics::udp::UdpComms,_(gmlc::networking::InterfaceTypes)1>_>_>
  bld;
  __shared_ptr<helics::CoreFactory::CoreBuilder,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  name._M_str._4_4_ = in_register_00000014;
  name._M_str._0_4_ = code;
  name._M_len = coreTypeName._M_str;
  __r = (__shared_ptr<helics::CoreFactory::CoreBuilder,_(__gnu_cxx::_Lock_policy)2> *)
        coreTypeName._M_len;
  std::
  make_shared<helics::CoreFactory::CoreTypeBuilder<helics::NetworkCore<helics::udp::UdpComms,(gmlc::networking::InterfaceTypes)1>>>
            ();
  std::
  static_pointer_cast<helics::CoreFactory::CoreBuilder,helics::CoreFactory::CoreTypeBuilder<helics::NetworkCore<helics::udp::UdpComms,(gmlc::networking::InterfaceTypes)1>>>
            ((shared_ptr<helics::CoreFactory::CoreTypeBuilder<helics::NetworkCore<helics::udp::UdpComms,_(gmlc::networking::InterfaceTypes)1>_>_>
              *)__r);
  std::__shared_ptr<helics::CoreFactory::CoreBuilder,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_48,__r);
  defineCoreBuilder((shared_ptr<helics::CoreFactory::CoreBuilder> *)&_Stack_48,name,in_ECX);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  sVar1.super___shared_ptr<helics::CoreFactory::CoreBuilder,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<helics::CoreFactory::CoreBuilder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)__r;
  return (shared_ptr<helics::CoreFactory::CoreBuilder>)
         sVar1.super___shared_ptr<helics::CoreFactory::CoreBuilder,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CoreBuilder> addCoreType(std::string_view coreTypeName, int code)
    {
        auto bld = std::make_shared<CoreTypeBuilder<CoreTYPE>>();
        std::shared_ptr<CoreBuilder> cbld = std::static_pointer_cast<CoreBuilder>(bld);
        defineCoreBuilder(cbld, coreTypeName, code);
        return cbld;
    }